

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void accumulate_counters_enc_workers(AV1_COMP *cpi,int num_workers)

{
  RD_COUNTS *pRVar1;
  uint64_t *puVar2;
  int *piVar3;
  uint *puVar4;
  ulong uVar5;
  uint8_t uVar6;
  void *pvVar7;
  MACROBLOCK *x;
  undefined1 *puVar8;
  macroblock *mb;
  long lVar9;
  bool bVar10;
  uint *cnt;
  long lVar11;
  uint i;
  long lVar12;
  int (*paiVar13) [16];
  int (*paiVar14) [2];
  long lVar15;
  ulong uVar16;
  
  if (0 < num_workers) {
    uVar16 = (ulong)(uint)num_workers;
    do {
      pvVar7 = (cpi->mt_info).workers[uVar16 - 1].data1;
      x = *(MACROBLOCK **)((long)pvVar7 + 8);
      cpi->intrabc_used = cpi->intrabc_used | *(uint *)(x[1].e_mbd.plane[0].seg_iqmatrix[7] + 3);
      cpi->deltaq_used =
           cpi->deltaq_used | *(uint *)((long)x[1].e_mbd.plane[0].seg_iqmatrix[7] + 0x1c);
      if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
        av1_accumulate_rtc_counters(cpi,x);
      }
      puVar8 = *(undefined1 **)((long)pvVar7 + 8);
      cpi->palette_pixel_num = cpi->palette_pixel_num + *(int *)(puVar8 + 0x25690);
      if ((ThreadData_conflict *)puVar8 != &cpi->td) {
        if ((cpi->sf).inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
          aom_free(*(void **)(puVar8 + 0x256b0));
          *(undefined8 *)(*(long *)((long)pvVar7 + 8) + 0x256b0) = 0;
        }
        if ((cpi->sf).intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
          aom_free(*(void **)(*(long *)((long)pvVar7 + 8) + 0x256b8));
          *(undefined8 *)(*(long *)((long)pvVar7 + 8) + 0x256b8) = 0;
        }
      }
      uVar6 = ((cpi->common).seq_params)->monochrome;
      mb = *(macroblock **)((long)pvVar7 + 8);
      aom_free((mb->txfm_search_info).mb_rd_record);
      (mb->txfm_search_info).mb_rd_record = (MB_RD_RECORD *)0x0;
      aom_free(mb->inter_modes_info);
      mb->inter_modes_info = (inter_modes_info *)0x0;
      av1_dealloc_src_diff_buf(mb,(uint)(uVar6 == '\0') * 2 + 1);
      aom_free((mb->e_mbd).seg_mask);
      (mb->e_mbd).seg_mask = (uint8_t *)0x0;
      aom_free(mb->winner_mode_stats);
      mb->winner_mode_stats = (WinnerModeStats *)0x0;
      aom_free(mb->dqcoeff_buf);
      mb->dqcoeff_buf = (tran_low_t *)0x0;
      if (uVar16 != 1) {
        lVar9 = *(long *)((long)pvVar7 + 8);
        lVar11 = *(long *)(lVar9 + 0x25c58);
        lVar12 = 0;
        do {
          puVar4 = (cpi->counts).switchable_interp[0] + lVar12;
          *puVar4 = *puVar4 + *(int *)(lVar11 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x30);
        pRVar1 = &(cpi->td).rd_counts;
        uVar5._0_4_ = pRVar1->compound_ref_used_flag;
        uVar5._4_4_ = pRVar1->skip_mode_used_flag;
        uVar5 = uVar5 | *(ulong *)(lVar9 + 0x256c0);
        pRVar1->compound_ref_used_flag = (int)uVar5;
        pRVar1->skip_mode_used_flag = (int)(uVar5 >> 0x20);
        lVar11 = lVar9 + 0x256c8;
        lVar12 = 0;
        paiVar13 = (cpi->td).rd_counts.tx_type_used;
        do {
          lVar15 = 0;
          do {
            (*paiVar13)[lVar15] = (*paiVar13)[lVar15] + *(int *)(lVar11 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          lVar12 = lVar12 + 1;
          paiVar13 = paiVar13 + 1;
          lVar11 = lVar11 + 0x40;
        } while (lVar12 != 0x13);
        lVar11 = lVar9 + 0x25b88;
        lVar12 = 0;
        paiVar14 = (cpi->td).rd_counts.obmc_used;
        do {
          lVar15 = 0;
          do {
            (*paiVar14)[lVar15] = (*paiVar14)[lVar15] + *(int *)(lVar11 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          lVar12 = lVar12 + 1;
          paiVar14 = paiVar14 + 1;
          lVar11 = lVar11 + 8;
        } while (lVar12 != 0x16);
        lVar11 = 0;
        do {
          piVar3 = (cpi->td).rd_counts.warped_used + lVar11;
          *piVar3 = *piVar3 + *(int *)(lVar9 + 0x25c38 + lVar11 * 4);
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
        puVar2 = (cpi->td).rd_counts.seg_tmp_pred_cost;
        *puVar2 = *puVar2 + *(long *)(lVar9 + 0x25c48);
        puVar2 = (cpi->td).rd_counts.seg_tmp_pred_cost + 1;
        *puVar2 = *puVar2 + *(long *)(lVar9 + 0x25c50);
        piVar3 = &(cpi->td).rd_counts.newmv_or_intra_blocks;
        *piVar3 = *piVar3 + *(int *)(lVar9 + 0x25c40);
        puVar4 = &(cpi->td).mb.txfm_search_info.txb_split_count;
        *puVar4 = *puVar4 + *(int *)(lVar9 + 0x25618);
      }
      bVar10 = 1 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar10);
  }
  return;
}

Assistant:

static inline void accumulate_counters_enc_workers(AV1_COMP *cpi,
                                                   int num_workers) {
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &cpi->mt_info.workers[i];
    EncWorkerData *const thread_data = (EncWorkerData *)worker->data1;
    cpi->intrabc_used |= thread_data->td->intrabc_used;
    cpi->deltaq_used |= thread_data->td->deltaq_used;
    // Accumulate rtc counters.
    if (!frame_is_intra_only(&cpi->common))
      av1_accumulate_rtc_counters(cpi, &thread_data->td->mb);
    cpi->palette_pixel_num += thread_data->td->mb.palette_pixels;
    if (thread_data->td != &cpi->td) {
      // Keep these conditional expressions in sync with the corresponding ones
      // in prepare_enc_workers().
      if (cpi->sf.inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->mv_costs_alloc);
        thread_data->td->mv_costs_alloc = NULL;
      }
      if (cpi->sf.intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->dv_costs_alloc);
        thread_data->td->dv_costs_alloc = NULL;
      }
    }
    av1_dealloc_mb_data(&thread_data->td->mb, av1_num_planes(&cpi->common));

    // Accumulate counters.
    if (i > 0) {
      av1_accumulate_frame_counts(&cpi->counts, thread_data->td->counts);
      accumulate_rd_opt(&cpi->td, thread_data->td);
      cpi->td.mb.txfm_search_info.txb_split_count +=
          thread_data->td->mb.txfm_search_info.txb_split_count;
#if CONFIG_SPEED_STATS
      cpi->td.mb.txfm_search_info.tx_search_count +=
          thread_data->td->mb.txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS
    }
  }
}